

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

void map2json_push(map2json_t *obj,char *key,char *value)

{
  int iVar1;
  undefined8 *puVar2;
  size_t sVar3;
  size_t sVar4;
  void *pvVar5;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  size_t valLen;
  size_t keyLen;
  size_t prefixLength;
  char *realKey;
  map2json_keyvalue_t *pair;
  char *local_28;
  
  puVar2 = (undefined8 *)malloc(0x18);
  local_28 = in_RSI;
  if (in_RDI[3] != 0) {
    sVar3 = strlen((char *)in_RDI[3]);
    iVar1 = strncmp(in_RSI,(char *)in_RDI[3],sVar3);
    if (iVar1 != 0) {
      return;
    }
    local_28 = in_RSI + sVar3 + 1;
  }
  sVar3 = strlen(local_28);
  sVar4 = strlen(in_RDX);
  if (((local_28[sVar3 - 2] != '[') || (local_28[sVar3 - 1] != 'o')) || (local_28[sVar3] != ']')) {
    pvVar5 = calloc(1,sVar3 + 1);
    *puVar2 = pvVar5;
    pvVar5 = calloc(1,sVar4 + 1);
    puVar2[1] = pvVar5;
    memcpy((void *)*puVar2,local_28,sVar3 + 1);
    memcpy((void *)puVar2[1],in_RDX,sVar4 + 1);
    puVar2[2] = *in_RDI;
    *in_RDI = puVar2;
  }
  return;
}

Assistant:

void map2json_push(map2json_t *obj, char *key, char *value) {
	DEBUG_TEXT("map2json_push([map2json_t *], %s, %s)... ", key, value);

	map2json_keyvalue_t *pair = (map2json_keyvalue_t *) malloc(sizeof(map2json_keyvalue_t));
	char *realKey;

	if ( obj->prefix == NULL ) {
		realKey = key;
	} else {
		size_t prefixLength = strlen(obj->prefix);
		if ( !strncmp(key, obj->prefix, prefixLength) ) {
			realKey = &key[prefixLength + 1];
		} else {
			DEBUG_TEXT("map2json_push([map2json_t *], %s, %s)... DONE", key, value);
			return;
		}
	}

	size_t keyLen = strlen(realKey) + 1;
	size_t valLen = strlen(value) + 1;

	if ( realKey[keyLen - 3] == JSON2MAP_MAP_ARRAY_START && realKey[keyLen - 2] == JSON2MAP_MAP_OBJECT_CODE && realKey[keyLen - 1] == JSON2MAP_MAP_ARRAY_END ) {
		DEBUG_TEXT("map2json_push([map2json_t *], %s, %s)... DONE", key, value);
		return;
	}

	pair->key = (char *) calloc(sizeof(char), keyLen);
	pair->value = (char *) calloc(sizeof(char), valLen);

	memcpy(pair->key, realKey, keyLen);
	memcpy(pair->value, value, valLen);

	pair->next = obj->pairs;
	obj->pairs = pair;

	DEBUG_TEXT("map2json_push([map2json_t *], %s, %s)... DONE", key, value);
}